

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O3

char * __thiscall
icu_63::CharStringByteSink::GetAppendBuffer
          (CharStringByteSink *this,int32_t min_capacity,int32_t desired_capacity_hint,char *scratch
          ,int32_t scratch_capacity,int32_t *result_capacity)

{
  uint in_EAX;
  char *pcVar1;
  UErrorCode status;
  undefined8 uStack_28;
  
  if (min_capacity < 1 || scratch_capacity < min_capacity) {
    *result_capacity = 0;
    pcVar1 = (char *)0x0;
  }
  else {
    uStack_28 = (ulong)in_EAX;
    pcVar1 = CharString::getAppendBuffer
                       (this->dest_,min_capacity,desired_capacity_hint,result_capacity,
                        (UErrorCode *)((long)&uStack_28 + 4));
    if (0 < uStack_28._4_4_) {
      *result_capacity = scratch_capacity;
      pcVar1 = scratch;
    }
  }
  return pcVar1;
}

Assistant:

char*
CharStringByteSink::GetAppendBuffer(int32_t min_capacity,
                                    int32_t desired_capacity_hint,
                                    char* scratch,
                                    int32_t scratch_capacity,
                                    int32_t* result_capacity) {
    if (min_capacity < 1 || scratch_capacity < min_capacity) {
        *result_capacity = 0;
        return nullptr;
    }

    UErrorCode status = U_ZERO_ERROR;
    char* result = dest_.getAppendBuffer(
            min_capacity,
            desired_capacity_hint,
            *result_capacity,
            status);
    if (U_SUCCESS(status)) {
        return result;
    }

    *result_capacity = scratch_capacity;
    return scratch;
}